

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptorwrapper.cpp
# Opt level: O0

off_t __thiscall DescriptorWrapper::seek(DescriptorWrapper *this,off_t offset,int whence)

{
  errType errorCode;
  PosixException *this_00;
  int *piVar1;
  allocator<char> local_49;
  string local_48;
  __off_t local_28;
  off_t offt;
  off_t oStack_18;
  int whence_local;
  off_t offset_local;
  DescriptorWrapper *this_local;
  
  offt._4_4_ = whence;
  oStack_18 = offset;
  offset_local = (off_t)this;
  local_28 = lseek(this->m_fd,offset,whence);
  if (local_28 == -1) {
    this_00 = (PosixException *)__cxa_allocate_exception(0x18);
    piVar1 = __errno_location();
    errorCode = *piVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Error while lseek",&local_49);
    PosixException::PosixException(this_00,errorCode,&local_48);
    __cxa_throw(this_00,&PosixException::typeinfo,PosixException::~PosixException);
  }
  return local_28;
}

Assistant:

off_t DescriptorWrapper::seek(off_t offset, int whence) 
{
	off_t offt = lseek(m_fd, offset, whence);
	if (offt == (off_t)(-1))
		throw PosixException(errno, "Error while lseek");
	return offt;
}